

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mod.c
# Opt level: O2

int BN_mod_lshift1_quick(BIGNUM *r,BIGNUM *a,BIGNUM *m)

{
  int iVar1;
  
  iVar1 = BN_lshift1(r,a);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = BN_cmp(r,m);
    if (-1 < iVar1) {
      iVar1 = BN_sub(r,r,m);
      return iVar1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int BN_mod_lshift1_quick(BIGNUM *r, const BIGNUM *a, const BIGNUM *m)
{
    if (!BN_lshift1(r, a))
        return 0;
    bn_check_top(r);
    if (BN_cmp(r, m) >= 0)
        return BN_sub(r, r, m);
    return 1;
}